

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setAttribute(QWidget *this,WidgetAttribute attribute,bool on)

{
  QWidgetPrivate *this_00;
  bool bVar1;
  char cVar2;
  QTLWExtra *pQVar3;
  QWidgetRepaintManager *this_01;
  QWidget *pQVar4;
  QWidget *pQVar5;
  undefined8 uVar6;
  QWidgetData *pQVar7;
  long lVar8;
  uint uVar9;
  Type TVar10;
  int i;
  QWidgetData **ppQVar11;
  ulong uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  if ((attribute == WA_ContentsMarginsRespectsSafeArea) &&
     (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) {
    pQVar3 = QWidgetPrivate::topData(this_00);
    pQVar3->field_0xe1 = pQVar3->field_0xe1 | 8;
  }
  bVar1 = testAttribute(this,attribute);
  if (bVar1 == on) goto switchD_002ee58f_caseD_51;
  if (attribute == WA_NativeWindow) {
    if (((this_00->field_0x252 & 0x80) == 0) &&
       (cVar2 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))(), cVar2 == '\0'
       )) goto switchD_002ee58f_caseD_51;
    pQVar7 = this->data;
LAB_002ee546:
    uVar13 = 1 << ((byte)attribute & 0x1f);
    uVar9 = attribute - WA_ForceDisabled >> 5;
    if (on) {
      this_00->high_attributes[uVar9] = this_00->high_attributes[uVar9] | uVar13;
    }
    else {
      this_00->high_attributes[uVar9] = this_00->high_attributes[uVar9] & ~uVar13;
    }
  }
  else {
    pQVar7 = this->data;
    if (0x1f < (int)attribute) goto LAB_002ee546;
    uVar9 = 1 << ((byte)attribute & 0x1f);
    if (on) {
      pQVar7->widget_attributes = pQVar7->widget_attributes | uVar9;
    }
    else {
      pQVar7->widget_attributes = pQVar7->widget_attributes & ~uVar9;
    }
  }
  ppQVar11 = &this->data;
  switch(attribute) {
  case WA_AcceptDrops:
    if (on) {
      lVar8 = *(long *)&this->field_0x8;
LAB_002ee973:
      if ((*(byte *)(lVar8 + 0x245) & 0x80) == 0) goto LAB_002ee97c;
    }
    else {
      if ((((pQVar7->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         (lVar8 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar8 != 0)) {
        lVar8 = *(long *)(lVar8 + 8);
        goto LAB_002ee973;
      }
LAB_002ee97c:
      setAttribute(this,WA_DropSiteRegistered,on);
    }
    TVar10 = AcceptDropsChange;
LAB_002ee9a0:
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,TVar10);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
    break;
  case WA_DropSiteRegistered:
    for (uVar12 = 0; uVar12 < *(ulong *)&this_00->field_0x28; uVar12 = uVar12 + 1) {
      pQVar4 = *(QWidget **)(*(long *)&this_00->field_0x20 + uVar12 * 8);
      if (((pQVar4 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar4->field_0x8 + 0x30) & 1) != 0))
         && ((((pQVar4->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
             ((uVar9 = *(uint *)(*(long *)&pQVar4->field_0x8 + 0x244), (uVar9 >> 0xe & 1) == 0 &&
              ((short)uVar9 < 0 != on)))))) {
        setAttribute(pQVar4,WA_DropSiteRegistered,on);
      }
    }
    break;
  case WA_WindowPropagation:
    QWidgetPrivate::resolvePalette(this_00);
    QWidgetPrivate::resolveFont(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetPrivate::resolveLocale(this_00);
      return;
    }
    goto LAB_002eea3c;
  case WA_NoX11EventCompression:
  case WA_TintedBackground:
  case WA_X11OpenGLOverlay:
  case WA_AlwaysShowToolTips:
  case WA_MacOpaqueSizeGrip:
  case WA_SetStyle:
  case WA_SetLocale:
  case WA_MacShowFocusRect:
  case WA_MacNormalSize:
  case WA_MacSmallSize:
  case WA_MacMiniSize:
  case WA_LayoutUsesWidgetRect:
  case WA_StyledBackground:
  case WA_LayoutUsesWidgetRect|WA_MouseTracking:
  case WA_CanHostQMdiSubWindowTitleBar:
  case WA_MacAlwaysShowToolWindow:
  case WA_StyleSheet:
  case WA_ShowWithoutActivating:
  case WA_X11BypassTransientForHint:
  case WA_DontCreateNativeAncestors:
  case WA_NativeWindow|WA_MouseTracking:
  case WA_X11NetWmWindowTypeDND|WA_UnderMouse:
  case WA_SetWindowModality:
  case WA_WState_WindowOpacitySet:
    break;
  case WA_NativeWindow:
    QWidgetPrivate::createTLExtra(this_00);
    if (on) {
      QWidgetPrivate::createTLSysExtra(this_00);
    }
    pQVar4 = QWidgetPrivate::effectiveFocusWidget(this_00);
    if ((((on) && ((*ppQVar11)->winid == 0)) &&
        (pQVar5 = (QWidget *)QGuiApplication::focusObject(), pQVar5 == this)) &&
       ((pQVar4->data->widget_attributes & 0x4000) != 0)) {
      QGuiApplication::inputMethod();
      QInputMethod::commit();
      uVar6 = QGuiApplication::inputMethod();
      QInputMethod::update(uVar6,1);
    }
    cVar2 = QCoreApplication::testAttribute(AA_DontCreateNativeWidgetSiblings);
    if ((cVar2 == '\0') && (lVar8 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar8 != 0)) {
      QWidgetPrivate::enforceNativeChildren(*(QWidgetPrivate **)(lVar8 + 8));
    }
    pQVar7 = *ppQVar11;
    if (((on) && (pQVar7->winid == 0)) &&
       ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0)) {
      QWidgetPrivate::createWinId(this_00);
      pQVar7 = *ppQVar11;
    }
    if (((((pQVar7->widget_attributes & 1) == 0) && ((pQVar4->data->widget_attributes & 1) == 0)) &&
        (pQVar5 = (QWidget *)QGuiApplication::focusObject(), pQVar5 == this)) &&
       ((pQVar4->data->widget_attributes & 0x4000) != 0)) {
LAB_002ee687:
      uVar6 = QGuiApplication::inputMethod();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QInputMethod::update(uVar6,1);
        return;
      }
      goto LAB_002eea3c;
    }
    break;
  case WA_DontShowOnScreen:
    if ((on) && ((pQVar7->widget_attributes & 0x8000) != 0)) {
      QWidgetPrivate::hide_sys(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidgetPrivate::show_sys(this_00);
        return;
      }
      goto LAB_002eea3c;
    }
    break;
  case WA_X11NetWmWindowTypeDesktop:
  case WA_X11NetWmWindowTypeDock:
  case WA_X11NetWmWindowTypeToolBar:
  case WA_X11NetWmWindowTypeMenu:
  case WA_X11NetWmWindowTypeUtility:
  case WA_X11NetWmWindowTypeSplash:
  case WA_X11NetWmWindowTypeDialog:
  case WA_X11NetWmWindowTypeDropDownMenu:
  case WA_X11NetWmWindowTypePopupMenu:
  case WA_X11NetWmWindowTypeToolTip:
  case WA_X11NetWmWindowTypeNotification:
  case WA_X11NetWmWindowTypeCombo:
  case WA_X11NetWmWindowTypeDND:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetPrivate::setNetWmWindowTypes(this_00,false);
      return;
    }
    goto LAB_002eea3c;
  case WA_TranslucentBackground:
    if (on) {
      setAttribute(this,WA_NoSystemBackground,true);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidgetPrivate::updateIsTranslucent(this_00);
      return;
    }
    goto LAB_002eea3c;
  default:
    switch(attribute) {
    case WA_MouseTracking:
      TVar10 = MouseTrackingChange;
      goto LAB_002ee9a0;
    case WA_MouseTracking|WA_UnderMouse:
    case WA_OpaquePaintEvent|WA_MouseTracking:
    case WA_LaidOut:
    case WA_UpdatesDisabled:
    case WA_Mapped:
    case WA_PaintOnScreen|WA_OpaquePaintEvent:
    case WA_PaintOnScreen|WA_StaticContents:
      break;
    case WA_OpaquePaintEvent:
    case WA_NoSystemBackground:
      goto switchD_002ee5d5_caseD_4;
    case WA_StaticContents:
      this_01 = QWidgetPrivate::maybeRepaintManager(this_00);
      if (this_01 != (QWidgetRepaintManager *)0x0) {
        if (on) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            QWidgetRepaintManager::addStaticWidget((QWidgetRepaintManager *)this_01,this);
            return;
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QWidgetRepaintManager::removeStaticWidget((QWidgetRepaintManager *)this_01,this);
          return;
        }
        goto LAB_002eea3c;
      }
      break;
    case WA_PaintOnScreen:
      QWidgetPrivate::updateIsOpaque(this_00);
      goto switchD_002ee5d5_caseD_4;
    case WA_InputMethodEnabled:
      pQVar4 = (QWidget *)QGuiApplication::focusObject();
      if (pQVar4 == this) {
        if (!on) {
          QGuiApplication::inputMethod();
          QInputMethod::commit();
        }
        goto LAB_002ee687;
      }
      break;
    default:
      if (attribute == WA_NoChildEventsFromChildren) {
        uVar13 = (uint)!on << 5;
        uVar9 = *(uint *)&this_00->field_0x30 & 0xffffffdf;
      }
      else {
        if (attribute != WA_NoChildEventsForParent) {
          if (attribute != WA_ShowModal) {
            if (attribute == WA_TabletTracking) {
              TVar10 = TabletTrackingChange;
              goto LAB_002ee9a0;
            }
            break;
          }
          uVar9 = *(uint *)&pQVar7->field_0x10;
          if (on) {
            if ((uVar9 & 0x30000) == 0) {
              uVar9 = uVar9 | 0x20000;
              goto LAB_002ee9dd;
            }
          }
          else {
            uVar9 = uVar9 & 0xfffcffff;
LAB_002ee9dd:
            *(uint *)&pQVar7->field_0x10 = uVar9;
          }
          if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              QWidgetPrivate::setModal_sys(this_00);
              return;
            }
            goto LAB_002eea3c;
          }
          break;
        }
        uVar13 = (uint)!on << 4;
        uVar9 = *(uint *)&this_00->field_0x30 & 0xffffffef;
      }
      *(uint *)&this_00->field_0x30 = uVar9 | uVar13;
    }
  }
switchD_002ee58f_caseD_51:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002eea3c:
  __stack_chk_fail();
switchD_002ee5d5_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QWidgetPrivate::updateIsOpaque(this_00);
    return;
  }
  goto LAB_002eea3c;
}

Assistant:

void QWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QWidget);

    if (attribute == Qt::WA_ContentsMarginsRespectsSafeArea) {
        if (isWindow()) {
            auto *topExtra = d->topData();
            topExtra->explicitContentsMarginsRespectsSafeArea = true;
        }
    }

    if (testAttribute(attribute) == on)
        return;

    static_assert(sizeof(d->high_attributes)*8 >= (Qt::WA_AttributeCount - sizeof(uint)*8),
                      "QWidget::setAttribute(WidgetAttribute, bool): "
                      "QWidgetPrivate::high_attributes[] too small to contain all attributes in WidgetAttribute");
#ifdef Q_OS_WIN
    // ### Don't use PaintOnScreen+paintEngine() to do native painting in some future release
    if (attribute == Qt::WA_PaintOnScreen && on && windowType() != Qt::Desktop && !inherits("QGLWidget")) {
        // see ::paintEngine for details
        paintEngine();
        if (d->noPaintOnScreen)
            return;
    }
#endif

    // Don't set WA_NativeWindow on platforms that don't support it -- except for QGLWidget, which depends on it
    if (attribute == Qt::WA_NativeWindow && !d->mustHaveWindowHandle) {
        QPlatformIntegration *platformIntegration = QGuiApplicationPrivate::platformIntegration();
        if (!platformIntegration->hasCapability(QPlatformIntegration::NativeWidgets))
            return;
    }

    setAttribute_internal(attribute, on, data, d);

    switch (attribute) {

#if QT_CONFIG(draganddrop)
    case Qt::WA_AcceptDrops:  {
        if (on && !testAttribute(Qt::WA_DropSiteRegistered))
            setAttribute(Qt::WA_DropSiteRegistered, true);
        else if (!on && (isWindow() || !parentWidget() || !parentWidget()->testAttribute(Qt::WA_DropSiteRegistered)))
            setAttribute(Qt::WA_DropSiteRegistered, false);
        QEvent e(QEvent::AcceptDropsChange);
        QCoreApplication::sendEvent(this, &e);
        break;
    }
    case Qt::WA_DropSiteRegistered:  {
        for (int i = 0; i < d->children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_AcceptDrops) && w->testAttribute(Qt::WA_DropSiteRegistered) != on)
                w->setAttribute(Qt::WA_DropSiteRegistered, on);
        }
        break;
    }
#endif

    case Qt::WA_NoChildEventsForParent:
        d->sendChildEvents = !on;
        break;
    case Qt::WA_NoChildEventsFromChildren:
        d->receiveChildEvents = !on;
        break;
    case Qt::WA_MacNormalSize:
    case Qt::WA_MacSmallSize:
    case Qt::WA_MacMiniSize:
#ifdef Q_OS_MAC
        {
            // We can only have one of these set at a time
            const Qt::WidgetAttribute MacSizes[] = { Qt::WA_MacNormalSize, Qt::WA_MacSmallSize,
                                                     Qt::WA_MacMiniSize };
            for (int i = 0; i < 3; ++i) {
                if (MacSizes[i] != attribute)
                    setAttribute_internal(MacSizes[i], false, data, d);
            }
            d->macUpdateSizeAttribute();
        }
#endif
        break;
    case Qt::WA_ShowModal:
        if (!on) {
            // reset modality type to NonModal when clearing WA_ShowModal
            data->window_modality = Qt::NonModal;
        } else if (data->window_modality == Qt::NonModal) {
            // If modality hasn't been set prior to setting WA_ShowModal, use
            // ApplicationModal.
            data->window_modality = Qt::ApplicationModal;
            // Some window managers do not allow us to enter modality after the
            // window is visible.The window must be hidden before changing the
            // windowModality property and then reshown.
        }
        if (testAttribute(Qt::WA_WState_Created)) {
            // don't call setModal_sys() before create()
            d->setModal_sys();
        }
        break;
    case Qt::WA_MouseTracking: {
        QEvent e(QEvent::MouseTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_TabletTracking: {
        QEvent e(QEvent::TabletTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_NativeWindow: {
        d->createTLExtra();
        if (on)
            d->createTLSysExtra();
#ifndef QT_NO_IM
        QWidget *focusWidget = d->effectiveFocusWidget();
        if (on && !internalWinId() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
        if (!QCoreApplication::testAttribute(Qt::AA_DontCreateNativeWidgetSiblings) && parentWidget())
            parentWidget()->d_func()->enforceNativeChildren();
        if (on && !internalWinId() && testAttribute(Qt::WA_WState_Created))
            d->createWinId();
        if (isEnabled() && focusWidget->isEnabled() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_PaintOnScreen:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_OpaquePaintEvent:
        d->updateIsOpaque();
        break;
    case Qt::WA_NoSystemBackground:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_UpdatesDisabled:
        d->updateSystemBackground();
        break;
    case Qt::WA_TransparentForMouseEvents:
        break;
    case Qt::WA_InputMethodEnabled: {
#ifndef QT_NO_IM
        if (QGuiApplication::focusObject() == this) {
            if (!on)
                QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_WindowPropagation:
        d->resolvePalette();
        d->resolveFont();
        d->resolveLocale();
        break;
    case Qt::WA_DontShowOnScreen: {
        if (on && isVisible()) {
            // Make sure we keep the current state and only hide the widget
            // from the desktop. show_sys will only update platform specific
            // attributes at this point.
            d->hide_sys();
            d->show_sys();
        }
        break;
    }

    case Qt::WA_X11NetWmWindowTypeDesktop:
    case Qt::WA_X11NetWmWindowTypeDock:
    case Qt::WA_X11NetWmWindowTypeToolBar:
    case Qt::WA_X11NetWmWindowTypeMenu:
    case Qt::WA_X11NetWmWindowTypeUtility:
    case Qt::WA_X11NetWmWindowTypeSplash:
    case Qt::WA_X11NetWmWindowTypeDialog:
    case Qt::WA_X11NetWmWindowTypeDropDownMenu:
    case Qt::WA_X11NetWmWindowTypePopupMenu:
    case Qt::WA_X11NetWmWindowTypeToolTip:
    case Qt::WA_X11NetWmWindowTypeNotification:
    case Qt::WA_X11NetWmWindowTypeCombo:
    case Qt::WA_X11NetWmWindowTypeDND:
        d->setNetWmWindowTypes();
        break;

    case Qt::WA_StaticContents:
        if (QWidgetRepaintManager *repaintManager = d->maybeRepaintManager()) {
            if (on)
                repaintManager->addStaticWidget(this);
            else
                repaintManager->removeStaticWidget(this);
        }
        break;
    case Qt::WA_TranslucentBackground:
        if (on)
            setAttribute(Qt::WA_NoSystemBackground);
        d->updateIsTranslucent();

        break;
    case Qt::WA_AcceptTouchEvents:
        break;
    default:
        break;
    }
}